

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateAccessChainToVar
          (InterfaceVariableScalarReplacement *this,uint32_t var_type_id,Instruction *var,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *index_ids,Instruction *insert_before,
          uint32_t *component_type_id)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  bool bVar1;
  uint32_t uVar2;
  StorageClass storage_class;
  uint32_t res_id;
  IRContext *pIVar3;
  DefUseManager *def_use_mgr_00;
  size_type sVar4;
  Instruction *this_00;
  reference puVar5;
  pointer pIVar6;
  Operand *local_188;
  Instruction *inst;
  iterator local_170;
  undefined8 local_168;
  SmallVector<unsigned_int,_2UL> local_160;
  Operand local_138;
  uint local_104;
  const_iterator cStack_100;
  uint32_t index_id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  iterator local_e0;
  undefined8 local_d8;
  SmallVector<unsigned_int,_2UL> local_d0;
  Operand local_a8;
  iterator local_78;
  _func_int **local_70;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_68;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_50;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_access_chain;
  uint32_t ptr_type_id;
  DefUseManager *def_use_mgr;
  uint32_t *component_type_id_local;
  Instruction *insert_before_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *index_ids_local;
  Instruction *var_local;
  uint32_t var_type_id_local;
  InterfaceVariableScalarReplacement *this_local;
  
  pIVar3 = Pass::context(&this->super_Pass);
  def_use_mgr_00 = IRContext::get_def_use_mgr(pIVar3);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(index_ids);
  uVar2 = anon_unknown_0::GetComponentTypeOfArrayMatrix(def_use_mgr_00,var_type_id,(uint32_t)sVar4);
  *component_type_id = uVar2;
  uVar2 = *component_type_id;
  storage_class = anon_unknown_0::GetStorageClass(var);
  new_access_chain._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       GetPointerType(this,uVar2,storage_class);
  this_00 = (Instruction *)::operator_new(0x70);
  pIVar3 = Pass::context(&this->super_Pass);
  uVar2 = new_access_chain._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  res_id = Pass::TakeNextId(&this->super_Pass);
  __range2._4_4_ = opt::Instruction::result_id(var);
  local_e0 = (iterator)((long)&__range2 + 4);
  local_d8 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_e0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_d0,init_list_00);
  Operand::Operand(&local_a8,SPV_OPERAND_TYPE_ID,&local_d0);
  local_78 = &local_a8;
  local_70 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator
            ((allocator<spvtools::opt::Operand> *)((long)&__range2 + 3));
  __l._M_len = (size_type)local_70;
  __l._M_array = local_78;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_68,__l,(allocator_type *)((long)&__range2 + 3));
  opt::Instruction::Instruction(this_00,pIVar3,OpAccessChain,uVar2,res_id,&local_68);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_50,this_00);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_68);
  std::allocator<spvtools::opt::Operand>::~allocator
            ((allocator<spvtools::opt::Operand> *)((long)&__range2 + 3));
  local_188 = (Operand *)&local_78;
  do {
    local_188 = local_188 + -1;
    Operand::~Operand(local_188);
  } while (local_188 != &local_a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_d0);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(index_ids);
  cStack_100 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(index_ids);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff00);
    if (!bVar1) break;
    puVar5 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    local_104 = *puVar5;
    pIVar6 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(&local_50);
    inst._4_4_ = local_104;
    local_170 = (iterator)((long)&inst + 4);
    local_168 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_170;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_160,init_list);
    Operand::Operand(&local_138,SPV_OPERAND_TYPE_ID,&local_160);
    opt::Instruction::AddOperand(pIVar6,&local_138);
    Operand::~Operand(&local_138);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_160);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  pIVar6 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::get(&local_50);
  analysis::DefUseManager::AnalyzeInstDefUse(def_use_mgr_00,pIVar6);
  opt::Instruction::InsertBefore(insert_before,&local_50);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_50);
  return pIVar6;
}

Assistant:

Instruction* InterfaceVariableScalarReplacement::CreateAccessChainToVar(
    uint32_t var_type_id, Instruction* var,
    const std::vector<uint32_t>& index_ids, Instruction* insert_before,
    uint32_t* component_type_id) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  *component_type_id = GetComponentTypeOfArrayMatrix(
      def_use_mgr, var_type_id, static_cast<uint32_t>(index_ids.size()));

  uint32_t ptr_type_id =
      GetPointerType(*component_type_id, GetStorageClass(var));

  std::unique_ptr<Instruction> new_access_chain(new Instruction(
      context(), spv::Op::OpAccessChain, ptr_type_id, TakeNextId(),
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {var->result_id()}}}));
  for (uint32_t index_id : index_ids) {
    new_access_chain->AddOperand({SPV_OPERAND_TYPE_ID, {index_id}});
  }

  Instruction* inst = new_access_chain.get();
  def_use_mgr->AnalyzeInstDefUse(inst);
  insert_before->InsertBefore(std::move(new_access_chain));
  return inst;
}